

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

bool __thiscall cmCTestRunProcess::StartProcess(cmCTestRunProcess *this)

{
  double timeout;
  int iVar1;
  pointer pbVar2;
  char *local_40;
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  
  args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pbVar2 = (this->CommandLineStrings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != (this->CommandLineStrings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    local_40 = (pbVar2->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&args,&local_40);
  }
  local_40 = (char *)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&args,&local_40);
  cmsysProcess_SetCommand
            (this->Process,
             args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  if ((this->WorkingDirectory)._M_string_length != 0) {
    cmsysProcess_SetWorkingDirectory(this->Process,(this->WorkingDirectory)._M_dataplus._M_p);
  }
  cmsysProcess_SetOption(this->Process,0,1);
  timeout = this->TimeOut;
  if ((timeout != -1.0) || (NAN(timeout))) {
    cmsysProcess_SetTimeout(this->Process,timeout);
  }
  cmsysProcess_Execute(this->Process);
  iVar1 = cmsysProcess_GetState(this->Process);
  this->PipeState = iVar1;
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return iVar1 - 3U < 2;
}

Assistant:

bool StartProcess()
  {
    std::vector<const char*> args;
    for (std::vector<std::string>::iterator i =
           this->CommandLineStrings.begin();
         i != this->CommandLineStrings.end(); ++i) {
      args.push_back(i->c_str());
    }
    args.push_back(CM_NULLPTR); // null terminate
    cmsysProcess_SetCommand(this->Process, &*args.begin());
    if (!this->WorkingDirectory.empty()) {
      cmsysProcess_SetWorkingDirectory(this->Process,
                                       this->WorkingDirectory.c_str());
    }

    cmsysProcess_SetOption(this->Process, cmsysProcess_Option_HideWindow, 1);
    if (this->TimeOut != -1) {
      cmsysProcess_SetTimeout(this->Process, this->TimeOut);
    }
    cmsysProcess_Execute(this->Process);
    this->PipeState = cmsysProcess_GetState(this->Process);
    // if the process is running or exited return true
    return this->PipeState == cmsysProcess_State_Executing ||
      this->PipeState == cmsysProcess_State_Exited;
  }